

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (a->num_bits < 0x10) {
    if (a->zbuffer_end <= a->zbuffer) {
      return -1;
    }
    stbi__fill_bits(a);
  }
  uVar1 = a->code_buffer;
  uVar2 = z->fast[uVar1 & 0x1ff];
  if (uVar2 == 0) {
    uVar2 = (ushort)uVar1 << 8 | (ushort)uVar1 >> 8;
    uVar4 = (uVar2 & 0xf0f) << 4 | (uVar2 & 0xf0f0) >> 4;
    uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4;
    uVar4 = (uVar4 >> 1 & 0x5555) + (uVar4 & 0x5555) * 2;
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + 1;
    } while (z->maxcode[lVar5 + 10] <= (int)uVar4);
    uVar3 = 0xffffffff;
    if (((lVar5 + 10U < 0x10) &&
        (lVar7 = (ulong)z->firstsymbol[lVar5 + 10] +
                 ((ulong)(uVar4 >> (7U - (char)lVar6 & 0x1f)) - (ulong)z->firstcode[lVar5 + 10]),
        (int)lVar7 < 0x120)) && ((ulong)*(byte *)((long)z + lVar7 + 0x484) - 9 == lVar6)) {
      a->code_buffer = uVar1 >> ((byte)(lVar5 + 10U) & 0x1f);
      a->num_bits = (a->num_bits - (int)lVar6) + -9;
      uVar3 = (uint)*(ushort *)((long)z + lVar7 * 2 + 0x5a4);
    }
  }
  else {
    a->code_buffer = uVar1 >> ((byte)(uVar2 >> 9) & 0x1f);
    a->num_bits = a->num_bits - (uint)(uVar2 >> 9);
    uVar3 = uVar2 & 0x1ff;
  }
  return uVar3;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) {
      if (stbi__zeof(a)) {
         return -1;   /* report error for unexpected end of data. */
      }
      stbi__fill_bits(a);
   }
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}